

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_ushl_vec(TCGContext_conflict1 *tcg_ctx,uint vece,TCGv_vec dst,TCGv_vec src,TCGv_vec shift)

{
  TCGv_vec r;
  TCGv_vec r_00;
  TCGv_vec r_01;
  TCGv_vec r_02;
  TCGv_vec pTVar1;
  TCGv_vec max;
  TCGv_vec msk;
  TCGv_vec rsh;
  TCGv_vec lsh;
  TCGv_vec rval;
  TCGv_vec lval;
  TCGv_vec shift_local;
  TCGv_vec src_local;
  TCGv_vec dst_local;
  uint vece_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  r = tcg_temp_new_vec_matching_aarch64(tcg_ctx,dst);
  r_00 = tcg_temp_new_vec_matching_aarch64(tcg_ctx,dst);
  r_01 = tcg_temp_new_vec_matching_aarch64(tcg_ctx,dst);
  r_02 = tcg_temp_new_vec_matching_aarch64(tcg_ctx,dst);
  tcg_gen_neg_vec_aarch64(tcg_ctx,vece,r_02,shift);
  if (vece == 0) {
    tcg_gen_mov_vec_aarch64(tcg_ctx,r_01,shift);
  }
  else {
    pTVar1 = tcg_temp_new_vec_matching_aarch64(tcg_ctx,dst);
    tcg_gen_dupi_vec_aarch64(tcg_ctx,vece,pTVar1,0xff);
    tcg_gen_and_vec_aarch64(tcg_ctx,vece,r_01,shift,pTVar1);
    tcg_gen_and_vec_aarch64(tcg_ctx,vece,r_02,r_02,pTVar1);
    tcg_temp_free_vec(tcg_ctx,pTVar1);
  }
  tcg_gen_shlv_vec_aarch64(tcg_ctx,vece,r,src,r_01);
  tcg_gen_shrv_vec_aarch64(tcg_ctx,vece,r_00,src,r_02);
  pTVar1 = tcg_temp_new_vec_matching_aarch64(tcg_ctx,dst);
  tcg_gen_dupi_vec_aarch64(tcg_ctx,vece,pTVar1,(long)(8 << ((byte)vece & 0x1f)));
  if (vece == 0) {
    tcg_gen_cmp_vec_aarch64(tcg_ctx,TCG_COND_GEU,0,r_01,r_01,pTVar1);
    tcg_gen_cmp_vec_aarch64(tcg_ctx,TCG_COND_GEU,0,r_02,r_02,pTVar1);
    tcg_gen_andc_vec_aarch64(tcg_ctx,0,r,r,r_01);
    tcg_gen_andc_vec_aarch64(tcg_ctx,0,r_00,r_00,r_02);
  }
  else {
    tcg_gen_cmp_vec_aarch64(tcg_ctx,TCG_COND_LT,vece,r_01,r_01,pTVar1);
    tcg_gen_cmp_vec_aarch64(tcg_ctx,TCG_COND_LT,vece,r_02,r_02,pTVar1);
    tcg_gen_and_vec_aarch64(tcg_ctx,vece,r,r,r_01);
    tcg_gen_and_vec_aarch64(tcg_ctx,vece,r_00,r_00,r_02);
  }
  tcg_gen_or_vec_aarch64(tcg_ctx,vece,dst,r,r_00);
  tcg_temp_free_vec(tcg_ctx,pTVar1);
  tcg_temp_free_vec(tcg_ctx,r);
  tcg_temp_free_vec(tcg_ctx,r_00);
  tcg_temp_free_vec(tcg_ctx,r_01);
  tcg_temp_free_vec(tcg_ctx,r_02);
  return;
}

Assistant:

static void gen_ushl_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec dst,
                         TCGv_vec src, TCGv_vec shift)
{
    TCGv_vec lval = tcg_temp_new_vec_matching(tcg_ctx, dst);
    TCGv_vec rval = tcg_temp_new_vec_matching(tcg_ctx, dst);
    TCGv_vec lsh = tcg_temp_new_vec_matching(tcg_ctx, dst);
    TCGv_vec rsh = tcg_temp_new_vec_matching(tcg_ctx, dst);
    TCGv_vec msk, max;

    tcg_gen_neg_vec(tcg_ctx, vece, rsh, shift);
    if (vece == MO_8) {
        tcg_gen_mov_vec(tcg_ctx, lsh, shift);
    } else {
        msk = tcg_temp_new_vec_matching(tcg_ctx, dst);
        tcg_gen_dupi_vec(tcg_ctx, vece, msk, 0xff);
        tcg_gen_and_vec(tcg_ctx, vece, lsh, shift, msk);
        tcg_gen_and_vec(tcg_ctx, vece, rsh, rsh, msk);
        tcg_temp_free_vec(tcg_ctx, msk);
    }

    /*
     * Rely on the TCG guarantee that out of range shifts produce
     * unspecified results, not undefined behaviour (i.e. no trap).
     * Discard out-of-range results after the fact.
     */
    tcg_gen_shlv_vec(tcg_ctx, vece, lval, src, lsh);
    tcg_gen_shrv_vec(tcg_ctx, vece, rval, src, rsh);

    max = tcg_temp_new_vec_matching(tcg_ctx, dst);
    tcg_gen_dupi_vec(tcg_ctx, vece, max, 8 << vece);

    /*
     * The choice of LT (signed) and GEU (unsigned) are biased toward
     * the instructions of the x86_64 host.  For MO_8, the whole byte
     * is significant so we must use an unsigned compare; otherwise we
     * have already masked to a byte and so a signed compare works.
     * Other tcg hosts have a full set of comparisons and do not care.
     */
    if (vece == MO_8) {
        tcg_gen_cmp_vec(tcg_ctx, TCG_COND_GEU, vece, lsh, lsh, max);
        tcg_gen_cmp_vec(tcg_ctx, TCG_COND_GEU, vece, rsh, rsh, max);
        tcg_gen_andc_vec(tcg_ctx, vece, lval, lval, lsh);
        tcg_gen_andc_vec(tcg_ctx, vece, rval, rval, rsh);
    } else {
        tcg_gen_cmp_vec(tcg_ctx, TCG_COND_LT, vece, lsh, lsh, max);
        tcg_gen_cmp_vec(tcg_ctx, TCG_COND_LT, vece, rsh, rsh, max);
        tcg_gen_and_vec(tcg_ctx, vece, lval, lval, lsh);
        tcg_gen_and_vec(tcg_ctx, vece, rval, rval, rsh);
    }
    tcg_gen_or_vec(tcg_ctx, vece, dst, lval, rval);

    tcg_temp_free_vec(tcg_ctx, max);
    tcg_temp_free_vec(tcg_ctx, lval);
    tcg_temp_free_vec(tcg_ctx, rval);
    tcg_temp_free_vec(tcg_ctx, lsh);
    tcg_temp_free_vec(tcg_ctx, rsh);
}